

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O1

void __thiscall Block::Block(Block *this,int id,int row,int column,int length,char direction)

{
  this->row = row;
  this->column = column;
  this->length = length;
  this->id = id;
  this->direction = (uint)(direction != 'h');
  return;
}

Assistant:

Block::Block(int id, int row, int column, int length, char direction) : row(row), column(column), length(length),
                                                                        direction(direction) {
    this->id = id;
    this->row = row;
    this->column = column;
    this->length = length;

    if (direction == 'h') {
        this->direction = HORIZONTAL;
    } else {
        this->direction = VERTICAL;
    }
}